

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O2

void __thiscall
siamese::RecoveryPacketList::Insert
          (RecoveryPacketList *this,RecoveryPacket *recovery,bool outOfOrder)

{
  RecoveryPacket *pRVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  RecoveryPacket **ppRVar5;
  RecoveryPacket *pRVar6;
  RecoveryPacket **ppRVar7;
  
  ppRVar5 = &this->Tail;
  pRVar6 = (RecoveryPacket *)0x0;
  ppRVar7 = ppRVar5;
  do {
    pRVar1 = *ppRVar7;
    if (pRVar1 == (RecoveryPacket *)0x0) {
      recovery->Next = pRVar6;
      recovery->Prev = (RecoveryPacket *)0x0;
      this->Head = recovery;
      if (pRVar6 != (RecoveryPacket *)0x0) {
LAB_00169908:
        ppRVar5 = &pRVar6->Prev;
      }
      *ppRVar5 = recovery;
      CheckedRegionState::Reset(this->CheckedRegion);
LAB_0016991b:
      this->RecoveryPacketCount = this->RecoveryPacketCount + 1;
      if (!outOfOrder) {
        uVar2 = (recovery->Metadata).ColumnStart;
        uVar3 = (recovery->Metadata).SumCount;
        uVar4 = (recovery->Metadata).LDPCCount;
        (this->LastRecoveryMetadata).Row = (recovery->Metadata).Row;
        (this->LastRecoveryMetadata).ColumnStart = uVar2;
        (this->LastRecoveryMetadata).SumCount = uVar3;
        (this->LastRecoveryMetadata).LDPCCount = uVar4;
        this->LastRecoveryBytes = (recovery->Buffer).Bytes;
      }
      return;
    }
    if ((pRVar1->ElementEnd <= recovery->ElementEnd) &&
       ((pRVar1->ElementEnd < recovery->ElementEnd ||
        (((recovery->Metadata).ColumnStart - (pRVar1->Metadata).ColumnStart >> 0x15 & 1) != 0)))) {
      recovery->Next = pRVar6;
      recovery->Prev = pRVar1;
      pRVar1->Next = recovery;
      if (pRVar6 != (RecoveryPacket *)0x0) goto LAB_00169908;
      *ppRVar5 = recovery;
      goto LAB_0016991b;
    }
    ppRVar7 = &pRVar1->Prev;
    pRVar6 = pRVar1;
  } while( true );
}

Assistant:

void RecoveryPacketList::Insert(RecoveryPacket* recovery, bool outOfOrder)
{
    RecoveryPacket* prev = Tail;
    RecoveryPacket* next = nullptr;

    const unsigned recoveryStart = recovery->Metadata.ColumnStart;
    const unsigned recoveryEnd   = recovery->ElementEnd;

    // Search for insertion point:
    for (; prev; next = prev, prev = prev->Prev)
    {
        const unsigned prevStart = prev->Metadata.ColumnStart;
        const unsigned prevEnd   = prev->ElementEnd;

        /*
            This insertion order guarantees that the left and right side of
            the recovery input ranges are monotonically increasing as in:

                recovery 0: 012345
                recovery 1:   23456 <- Cauchy row
                recovery 2: 01234567
                recovery 3:     45678
                recovery 4:     456789
        */
        if (recoveryEnd >= prevEnd)
        {
            if (recoveryEnd > prevEnd) {
                break;
            }
            if (IsColumnDeltaNegative(SubtractColumns(recoveryStart, prevStart))) {
                break;
            }
        }
    }

    // Insert into linked list
    recovery->Next = next;
    recovery->Prev = prev;
    if (prev) {
        prev->Next = recovery;
    }
    else {
        Head = recovery;
    }
    if (next) {
        next->Prev = recovery;
    }
    else {
        Tail = recovery;
    }

    // If inserting at head or somewhere in the middle:
    // Invalidate the checked region because a smaller solution may be available
    if (!prev || next) {
        CheckedRegion->Reset();
    }
    // Note that for the case where we insert at the end of a non-empty list we do
    // not reset the checked region.  This is the common case where recovery data is
    // received in order.

    ++RecoveryPacketCount;

    if (!outOfOrder)
    {
        // Update the last received recovery metadata
        LastRecoveryMetadata = recovery->Metadata;
        LastRecoveryBytes = recovery->Buffer.Bytes;
    }
}